

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O1

void ppDiv(word *q,word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  word wVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  word *b_00;
  ulong local_68;
  size_t local_48;
  
  sVar4 = wwBitSize(a,n);
  sVar5 = wwBitSize(b,m);
  if (sVar4 < sVar5) {
    wwSetZero(q,(n - m) + 1);
  }
  else {
    puVar1 = (undefined8 *)((long)stack + n * 8);
    b_00 = puVar1 + 1;
    lVar2 = m * 8 + n * 8 + 8;
    wwCopy((word *)stack,a,n);
    *puVar1 = 0;
    wwCopy(b_00,b,m);
    sVar4 = wwBitSize(b + (m - 1),1);
    uVar3 = (int)sVar4 - 1U & 0x3f;
    if (uVar3 == 0) {
      q[n - m] = 0;
      local_68 = m - 1;
      local_48 = 0;
      r[m - 1] = 0;
    }
    else {
      local_48 = 0x40 - (ulong)uVar3;
      wwShHi((word *)stack,n + 1,local_48);
      wwShHi(b_00,m,local_48);
      local_68 = m;
    }
    *(undefined8 *)((long)stack + m * 8 + n * 8 + 8) = 0;
    *(undefined8 *)((long)stack + m * 8 + n * 8 + 0x10) = 1;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x18) =
         *(ulong *)((long)stack +
                   (*(long *)((long)stack + local_68 * 8 + n * 8) >> 0x3f) * -8 + lVar2) ^ 2;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x20) =
         *(ulong *)((long)stack +
                   (ulong)(-1 < *(long *)((long)stack + local_68 * 8 + n * 8)) * 8 + lVar2) ^ 2;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x28) =
         *(ulong *)((long)stack +
                   (*(ulong *)((long)stack + local_68 * 8 + n * 8) >> 0x3e) * 8 + lVar2) ^ 4;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x30) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3e
                                 ) ^ 1) * 8 + lVar2) ^ 4;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x38) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3e
                                 ) ^ 2) * 8 + lVar2) ^ 4;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x40) =
         *(ulong *)((long)stack +
                   (~*(ulong *)((long)stack + local_68 * 8 + n * 8) >> 0x3e) * 8 + lVar2) ^ 4;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x48) =
         *(ulong *)((long)stack +
                   (*(ulong *)((long)stack + local_68 * 8 + n * 8) >> 0x3d) * 8 + lVar2) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x50) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 1) * 8 + lVar2) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x58) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 2) * 8 + lVar2) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x60) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 3) * 8 + lVar2) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x68) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 4) * 8 + lVar2) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x70) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 5) * 8 + lVar2) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x78) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + local_68 * 8 + n * 8) >> 0x3d
                                 ) ^ 6) * 8 + lVar2) ^ 8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x80) =
         *(ulong *)((long)stack +
                   (~*(ulong *)((long)stack + local_68 * 8 + n * 8) >> 0x3d) * 8 + lVar2) ^ 8;
    *(undefined8 *)((long)stack + m * 8 + n * 8 + 0x88) = 0;
    lVar10 = *(long *)((long)stack + local_68 * 8 + n * 8);
    *(long *)((long)stack + m * 8 + n * 8 + 0x90) = lVar10;
    *(long *)((long)stack + m * 8 + n * 8 + 0x98) = lVar10 * 2;
    uVar6 = lVar10 * 2 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xa0) = uVar6;
    *(long *)((long)stack + m * 8 + n * 8 + 0xa8) = lVar10 * 4;
    uVar8 = lVar10 * 4 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xb0) = uVar8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xb8) = uVar6 * 2;
    uVar9 = uVar6 * 2 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xc0) = uVar9;
    *(long *)((long)stack + m * 8 + n * 8 + 200) = lVar10 << 3;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xd0) =
         lVar10 << 3 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    uVar8 = uVar8 * 2;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xd8) = uVar8;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xe0) =
         uVar8 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xe8) = uVar6 << 2;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xf0) =
         uVar6 << 2 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    uVar9 = uVar9 * 2;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0xf8) = uVar9;
    *(ulong *)((long)stack + m * 8 + n * 8 + 0x100) =
         uVar9 ^ *(ulong *)((long)stack + local_68 * 8 + n * 8);
    if (local_68 <= n) {
      lVar10 = n * 8 + local_68 * -8;
      sVar4 = n;
      do {
        uVar8 = *(ulong *)((long)stack + sVar4 * 8);
        wVar7 = *(word *)((long)stack + (uVar8 >> 0x3c) * 8 + lVar2);
        q[sVar4 - local_68] = wVar7;
        uVar8 = *(ulong *)((long)stack + (ulong)((uint)wVar7 & 0xf) * 8 + lVar2 + 0x80) >> 4 ^ uVar8
        ;
        uVar9 = *(ulong *)((long)stack + (ulong)((byte)(uVar8 >> 0x38) & 0xf) * 8 + lVar2);
        uVar6 = wVar7 << 4 ^ uVar9;
        q[sVar4 - local_68] = uVar6;
        uVar8 = *(ulong *)((long)stack + (ulong)((uint)uVar9 & 0xf) * 8 + lVar2 + 0x80) >> 8 ^ uVar8
        ;
        uVar9 = *(ulong *)((long)stack + (ulong)((uint)(uVar8 >> 0x34) & 0xf) * 8 + lVar2);
        uVar6 = uVar6 << 4 ^ uVar9;
        q[sVar4 - local_68] = uVar6;
        uVar8 = *(ulong *)((long)stack + (ulong)((uint)uVar9 & 0xf) * 8 + lVar2 + 0x80) >> 0xc ^
                uVar8;
        uVar9 = *(ulong *)((long)stack + (ulong)((ushort)(uVar8 >> 0x30) & 0xf) * 8 + lVar2);
        uVar6 = uVar6 << 4 ^ uVar9;
        q[sVar4 - local_68] = uVar6;
        uVar8 = *(ulong *)((long)stack + (ulong)((uint)uVar9 & 0xf) * 8 + lVar2 + 0x80) >> 0x10 ^
                uVar8;
        uVar9 = *(ulong *)((long)stack + (ulong)((uint)(uVar8 >> 0x2c) & 0xf) * 8 + lVar2);
        uVar6 = uVar6 << 4 ^ uVar9;
        q[sVar4 - local_68] = uVar6;
        uVar8 = *(ulong *)((long)stack + (ulong)((uint)uVar9 & 0xf) * 8 + lVar2 + 0x80) >> 0x14 ^
                uVar8;
        uVar9 = *(ulong *)((long)stack + (ulong)((uint)(uVar8 >> 0x28) & 0xf) * 8 + lVar2);
        uVar6 = uVar6 << 4 ^ uVar9;
        q[sVar4 - local_68] = uVar6;
        uVar8 = *(ulong *)((long)stack + (ulong)((uint)uVar9 & 0xf) * 8 + lVar2 + 0x80) >> 0x18 ^
                uVar8;
        uVar9 = *(ulong *)((long)stack + (ulong)((uint)(uVar8 >> 0x24) & 0xf) * 8 + lVar2);
        uVar6 = uVar6 << 4 ^ uVar9;
        q[sVar4 - local_68] = uVar6;
        uVar8 = *(ulong *)((long)stack + (ulong)((uint)uVar9 & 0xf) * 8 + lVar2 + 0x80) >> 0x1c ^
                uVar8;
        uVar9 = *(ulong *)((long)stack + (ulong)((uint)(uVar8 >> 0x20) & 0xf) * 8 + lVar2);
        uVar6 = uVar6 << 4 ^ uVar9;
        q[sVar4 - local_68] = uVar6;
        uVar3 = (uint)uVar8 ^ *(uint *)((long)stack + (ulong)((uint)uVar9 & 0xf) * 8 + lVar2 + 0x84)
        ;
        uVar8 = *(ulong *)((long)stack + (ulong)(uVar3 >> 0x1c) * 8 + lVar2);
        uVar9 = uVar6 << 4 ^ uVar8;
        q[sVar4 - local_68] = uVar9;
        uVar3 = (uint)((ulong)*(undefined8 *)
                               ((long)stack + (ulong)((uint)uVar8 & 0xf) * 8 + lVar2 + 0x80) >> 0x24
                      ) ^ uVar3;
        uVar8 = *(ulong *)((long)stack + (ulong)(uVar3 >> 0x15 & 0x78) + lVar2);
        uVar9 = uVar9 << 4 ^ uVar8;
        q[sVar4 - local_68] = uVar9;
        uVar3 = (uint)((ulong)*(undefined8 *)
                               ((long)stack + (ulong)((uint)uVar8 & 0xf) * 8 + lVar2 + 0x80) >> 0x28
                      ) ^ uVar3;
        uVar8 = *(ulong *)((long)stack + (ulong)(uVar3 >> 0x11 & 0x78) + lVar2);
        uVar9 = uVar9 << 4 ^ uVar8;
        q[sVar4 - local_68] = uVar9;
        uVar3 = (uint)((ulong)*(undefined8 *)
                               ((long)stack + (ulong)((uint)uVar8 & 0xf) * 8 + lVar2 + 0x80) >> 0x2c
                      ) ^ uVar3;
        uVar8 = *(ulong *)((long)stack + (ulong)(uVar3 >> 0xd & 0x78) + lVar2);
        uVar9 = uVar9 << 4 ^ uVar8;
        q[sVar4 - local_68] = uVar9;
        uVar3 = *(ushort *)((long)stack + (ulong)((uint)uVar8 & 0xf) * 8 + lVar2 + 0x86) ^ uVar3;
        uVar8 = *(ulong *)((long)stack + (ulong)(uVar3 >> 9 & 0x78) + lVar2);
        uVar9 = uVar9 << 4 ^ uVar8;
        q[sVar4 - local_68] = uVar9;
        uVar3 = (uint)((ulong)*(undefined8 *)
                               ((long)stack + (ulong)((uint)uVar8 & 0xf) * 8 + lVar2 + 0x80) >> 0x34
                      ) ^ uVar3;
        uVar8 = *(ulong *)((long)stack + (ulong)(uVar3 >> 5 & 0x78) + lVar2);
        uVar9 = uVar9 << 4 ^ uVar8;
        q[sVar4 - local_68] = uVar9;
        uVar3 = *(byte *)((long)stack + (ulong)((uint)uVar8 & 0xf) * 8 + lVar2 + 0x87) ^ uVar3;
        uVar8 = *(ulong *)((long)stack + (ulong)(uVar3 >> 1 & 0x78) + lVar2);
        uVar9 = uVar9 << 4 ^ uVar8;
        q[sVar4 - local_68] = uVar9;
        uVar8 = uVar9 << 4 ^
                *(ulong *)((long)stack +
                          (ulong)((uint)((ulong)*(undefined8 *)
                                                 ((long)stack +
                                                 (ulong)((uint)uVar8 & 0xf) * 8 + lVar2 + 0x80) >>
                                        0x3c) ^ uVar3 & 0xf) * 8 + lVar2);
        q[sVar4 - local_68] = uVar8;
        wVar7 = ppAddMulW((word *)((long)stack + lVar10),b_00,local_68,uVar8,
                          (void *)((long)stack + m * 8 + n * 8 + 0x108));
        uVar8 = wVar7 ^ *(ulong *)((long)stack + sVar4 * 8);
        *(ulong *)((long)stack + sVar4 * 8) = uVar8;
        *(ulong *)((long)stack + sVar4 * 8) = uVar8 ^ q[sVar4 - local_68];
        sVar4 = sVar4 - 1;
        lVar10 = lVar10 + -8;
      } while (local_68 <= sVar4);
    }
    wwShLo((word *)stack,n + 1,local_48);
    m = local_68;
    a = (word *)stack;
  }
  wwCopy(r,a,m);
  return;
}

Assistant:

void ppDiv(word q[], word r[], const word a[], size_t n, const word b[],
	size_t m, void* stack)
{
	register word dividentHi;
	register size_t shift;
	size_t i;
	// переменные в stack
	word* divident;		/* нормализованное делимое (n + 1 слово) */
	word* divisor;		/* нормализованный делитель (m слов) */
	word* w1;			/* таблица частных (16 слов) */
	word* w2;			/* таблица умножения (16 слов) */
	// pre
	ASSERT(n >= m);
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(wwIsDisjoint2(q, n + 1 - m, r, m));
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// deg(a) < deg(b)?
	if (wwBitSize(a, n) < wwBitSize(b, m))
	{
		// q <- 0, r <- a
		wwSetZero(q, n - m + 1);
		wwCopy(r, a, m);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	w1 = divisor + m;
	w2 = w1 + 16;
	stack = w2 + 16;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация -- сделать старший разряд divisor первым в старшем
	// (возможно неявном) слове
	shift = (wwBitSize(b + m - 1, 1) - 1) % B_PER_W;
	// нормализация не нужна?
	if (shift == 0)
		// обнуляем старшие слова q и r
		q[n - m] = 0, r[--m] = 0;
	else
		// сдвигаем divisor и divident
		shift = B_PER_W - shift,
		wwShHi(divident, n + 1, shift),
		wwShHi(divisor, m, shift);
	// строим таблицы
	_DIV_PRE_S4(w1, divisor[m - 1]);
	_MUL_PRE_S4(w2, divisor[m - 1]);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// q[i - m] <- divident[i] \div divisor[m - 1]
		dividentHi = divident[i];
		_DIV_DIV_S4(dividentHi, q[i - m], w1, w2);
		// divident <- divident - divisor * X^{i - m} * q[i - m]
		divident[i] ^=
			ppAddMulW(divident + i - m, divisor, m, q[i - m], stack);
		// обработаем неявный старший разряд divisor
		divident[i] ^= q[i - m];
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	shift = 0;
	dividentHi = 0;
}